

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_1::PointCase::iterate(PointCase *this)

{
  int iVar1;
  TestLog *pTVar2;
  PixelFormat *pPVar3;
  MessageBuilder *pMVar4;
  float extraout_XMM0_Da;
  MessageBuilder local_2d8;
  undefined1 local_158 [8];
  PointSceneSpec scene;
  RasterizationArguments args;
  bool compareOk;
  vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_> points;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  Surface resultImage;
  float pointSize;
  ScopedLogSection section;
  int local_9c;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string iterationDescription;
  PointCase *this_local;
  
  local_9c = *(int *)&(this->super_BaseRenderingCase).field_0xc4 + 1;
  iterationDescription.field_2._8_8_ = this;
  de::toString<int>(&local_98,&local_9c);
  std::operator+(&local_78,"Test iteration ",&local_98);
  std::operator+(&local_58,&local_78," / ");
  de::toString<int>((string *)&section,&this->m_iterationCount);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section);
  std::__cxx11::string::~string((string *)&section);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  pTVar2 = tcu::TestContext::getLog
                     ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&stack0xffffffffffffff28,pTVar2,(string *)local_38,
             (string *)local_38);
  (*(this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
            ();
  iVar1 = (this->super_BaseRenderingCase).m_renderSize;
  resultImage.m_pixels.m_cap._4_4_ = extraout_XMM0_Da;
  tcu::Surface::Surface
            ((Surface *)
             &drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,iVar1,iVar1);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &points.
              super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>::
  vector((vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
          *)&args.blueBits);
  if (this->m_maxPointSize < resultImage.m_pixels.m_cap._4_4_) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode
                        .m_testCtx);
    tcu::TestLog::operator<<(&local_2d8,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_2d8,(char (*) [12])"Point size ");
    pMVar4 = tcu::MessageBuilder::operator<<
                       (pMVar4,(float *)((long)&resultImage.m_pixels.m_cap + 4));
    pMVar4 = tcu::MessageBuilder::operator<<
                       (pMVar4,(char (*) [36])" not supported, skipping iteration.");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2d8);
  }
  else {
    generatePoints(this,*(int *)&(this->super_BaseRenderingCase).field_0xc4,
                   (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                   &points.
                    super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                    *)&args.blueBits);
    BaseRenderingCase::drawPrimitives
              (&this->super_BaseRenderingCase,
               (Surface *)
               &drawBuffer.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &points.
                super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    tcu::PointSceneSpec::PointSceneSpec((PointSceneSpec *)local_158);
    scene.points.
    super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         (this->super_BaseRenderingCase).m_numSamples;
    scene.points.
    super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         (this->super_BaseRenderingCase).m_subpixelBits;
    pPVar3 = BaseRenderingCase::getPixelFormat(&this->super_BaseRenderingCase);
    args.numSamples = pPVar3->redBits;
    pPVar3 = BaseRenderingCase::getPixelFormat(&this->super_BaseRenderingCase);
    args.subpixelBits = pPVar3->greenBits;
    pPVar3 = BaseRenderingCase::getPixelFormat(&this->super_BaseRenderingCase);
    args.redBits = pPVar3->blueBits;
    std::vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>::
    swap((vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
          *)local_158,
         (vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
          *)&args.blueBits);
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode
                        .m_testCtx);
    args.greenBits._3_1_ =
         tcu::verifyPointGroupRasterization
                   ((Surface *)
                    &drawBuffer.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(PointSceneSpec *)local_158,
                    (RasterizationArguments *)
                    &scene.points.
                     super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,pTVar2);
    if (!(bool)args.greenBits._3_1_) {
      this->m_allIterationsPassed = false;
    }
    tcu::PointSceneSpec::~PointSceneSpec((PointSceneSpec *)local_158);
  }
  iVar1 = *(int *)&(this->super_BaseRenderingCase).field_0xc4 + 1;
  *(int *)&(this->super_BaseRenderingCase).field_0xc4 = iVar1;
  if (iVar1 == this->m_iterationCount) {
    if ((this->m_allIterationsPassed & 1U) == 0) {
      tcu::TestContext::setTestResult
                ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Incorrect rasterization");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    }
    this_local._4_4_ = STOP;
  }
  else {
    this_local._4_4_ = CONTINUE;
  }
  std::vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>::
  ~vector((vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
           *)&args.blueBits);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &points.
              super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::Surface::~Surface
            ((Surface *)
             &drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&stack0xffffffffffffff28);
  std::__cxx11::string::~string((string *)local_38);
  return this_local._4_4_;
}

Assistant:

PointCase::IterateResult PointCase::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_testCtx.getLog(), iterationDescription, iterationDescription);
	const float								pointSize				= getPointSize();
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	std::vector<PointSceneSpec::ScenePoint>	points;

	// supported?
	if (pointSize <= m_maxPointSize)
	{
		// gen data
		generatePoints(m_iteration, drawBuffer, points);

		// draw image
		drawPrimitives(resultImage, drawBuffer, GL_POINTS);

		// compare
		{
			bool					compareOk;
			RasterizationArguments	args;
			PointSceneSpec			scene;

			args.numSamples		= m_numSamples;
			args.subpixelBits	= m_subpixelBits;
			args.redBits		= getPixelFormat().redBits;
			args.greenBits		= getPixelFormat().greenBits;
			args.blueBits		= getPixelFormat().blueBits;

			scene.points.swap(points);

			compareOk = verifyPointGroupRasterization(resultImage, scene, args, m_testCtx.getLog());

			if (!compareOk)
				m_allIterationsPassed = false;
		}
	}
	else
		m_testCtx.getLog() << tcu::TestLog::Message << "Point size " << pointSize << " not supported, skipping iteration." << tcu::TestLog::EndMessage;

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Incorrect rasterization");

		return STOP;
	}
	else
		return CONTINUE;
}